

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# networkincludes.cpp
# Opt level: O2

string * __thiscall
network_pimpl::getTimestamp_endpoint_abi_cxx11_(string *__return_storage_ptr__,network_pimpl *this)

{
  std::__cxx11::string::string((string *)__return_storage_ptr__,(string *)&this->timestamp_endpoint)
  ;
  return __return_storage_ptr__;
}

Assistant:

std::string network_pimpl::getTimestamp_endpoint() const
{
    return timestamp_endpoint;
}